

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O2

void Ssc_GiaRandomPiPattern(Gia_Man_t *p,int nWords,Vec_Int_t *vPivot)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  word *pwVar4;
  word wVar5;
  int i;
  long lVar6;
  
  Ssc_GiaResetPiPattern(p,nWords);
  pwVar4 = Gia_ObjSimPi(p,0);
  for (i = 0; i < p->vCis->nSize - p->nRegs; i = i + 1) {
    if (vPivot == (Vec_Int_t *)0x0) {
      uVar2 = Gia_ManRandom(0);
      uVar3 = Gia_ManRandom(0);
      wVar5 = (ulong)uVar3 << 2 | (ulong)uVar2 << 0x20 | 2;
    }
    else {
      iVar1 = Vec_IntEntry(vPivot,i);
      uVar2 = Gia_ManRandom(0);
      uVar3 = Gia_ManRandom(0);
      wVar5 = (long)iVar1 | (ulong)uVar2 << 0x20 | (ulong)uVar3 * 2;
    }
    *pwVar4 = wVar5;
    for (lVar6 = 1; lVar6 < nWords; lVar6 = lVar6 + 1) {
      uVar2 = Gia_ManRandom(0);
      uVar3 = Gia_ManRandom(0);
      pwVar4[lVar6] = CONCAT44(uVar2,uVar3);
    }
    pwVar4 = pwVar4 + nWords;
  }
  return;
}

Assistant:

void Ssc_GiaRandomPiPattern( Gia_Man_t * p, int nWords, Vec_Int_t * vPivot )
{
    word * pSimPi;
    int i, w;
    Ssc_GiaResetPiPattern( p, nWords );
    pSimPi = Gia_ObjSimPi( p, 0 );
    for ( i = 0; i < Gia_ManPiNum(p); i++, pSimPi += nWords )
    {
        pSimPi[0] = vPivot ? Ssc_Random1(Vec_IntEntry(vPivot, i)) : Ssc_Random2();
        for ( w = 1; w < nWords; w++ )
            pSimPi[w] = Ssc_Random();
//        if ( i < 10 )
//            Extra_PrintBinary( stdout, (unsigned *)pSimPi, 64 ), printf( "\n" );
    }
}